

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_truncated_ab_variance(double mu,double s,double a,double b)

{
  double x;
  double x_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  __type _Var5;
  double variance;
  double beta_pdf;
  double beta_cdf;
  double beta;
  double alpha_pdf;
  double alpha_cdf;
  double alpha;
  double b_local;
  double a_local;
  double s_local;
  double mu_local;
  
  x = (a - mu) / s;
  x_00 = (b - mu) / s;
  dVar1 = normal_01_pdf(x);
  dVar2 = normal_01_pdf(x_00);
  dVar3 = normal_01_cdf(x);
  dVar4 = normal_01_cdf(x_00);
  _Var5 = std::pow<double,int>((dVar1 - dVar2) / (dVar4 - dVar3),2);
  return s * s * (((x * dVar1 + -(x_00 * dVar2)) / (dVar4 - dVar3) + 1.0) - _Var5);
}

Assistant:

double normal_truncated_ab_variance ( double mu, double s, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_AB_VARIANCE returns the variance of the truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double A, B, the lower and upper truncation limits.
//
//    Output, double NORMAL_TRUNCATED_AB_VARIANCE, the variance of the PDF.
//
{
  double alpha;
  double alpha_cdf;
  double alpha_pdf;
  double beta;
  double beta_cdf;
  double beta_pdf;
  double variance;

  alpha = ( a - mu ) / s;
  beta = ( b - mu ) / s;

  alpha_pdf = normal_01_pdf ( alpha );
  beta_pdf = normal_01_pdf ( beta );

  alpha_cdf = normal_01_cdf ( alpha );
  beta_cdf = normal_01_cdf ( beta );

  variance = s * s * ( 1.0 
    + ( alpha * alpha_pdf - beta * beta_pdf ) / ( beta_cdf - alpha_cdf ) 
    - pow ( ( alpha_pdf - beta_pdf ) / ( beta_cdf - alpha_cdf ), 2 ) );

  return variance;
}